

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraphFlattener::convertMultiLevelInstances
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  Node *pNVar2;
  GroupNode *this_00;
  mapped_type *pmVar3;
  key_type *in_RDX;
  Node *pNVar4;
  bool bVar5;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  group;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  local_38;
  
  pNVar2 = node[3].ptr;
  if (pNVar2 != (Node *)0x0) {
    pNVar1 = in_RDX->ptr;
    pNVar4 = (Node *)(node + 2);
    do {
      bVar5 = (Node *)(pNVar2->fileName).field_2._M_allocated_capacity < pNVar1;
      if (!bVar5) {
        pNVar4 = pNVar2;
      }
      pNVar2 = (Node *)(&(pNVar2->fileName)._M_dataplus)[bVar5]._M_p;
    } while (pNVar2 != (Node *)0x0);
    if ((pNVar4 != (Node *)(node + 2)) &&
       ((Node *)(pNVar4->fileName).field_2._M_allocated_capacity <= pNVar1)) {
      pmVar3 = std::
               map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)(node + 1),in_RDX);
      pNVar2 = pmVar3->ptr;
      (this->node).ptr = pNVar2;
      if (pNVar2 == (Node *)0x0) {
        return (Ref<embree::SceneGraph::Node>)(Node *)this;
      }
      (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
      return (Ref<embree::SceneGraph::Node>)(Node *)this;
    }
  }
  local_38.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  convertMultiLevelInstances((SceneGraphFlattener *)node,&local_38,in_RDX);
  this_00 = (GroupNode *)operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,&local_38);
  pmVar3 = std::
           map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
           ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                         *)(node + 1),in_RDX);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (pmVar3->ptr != (Node *)0x0) {
    (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  pmVar3->ptr = (Node *)this_00;
  (this->node).ptr = (Node *)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::~vector(&local_38);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> convertMultiLevelInstances(const Ref<SceneGraph::Node>& node)
    {
      if (object_mapping.find(node) != object_mapping.end()) {
        return object_mapping[node];
      }
      
      std::vector<Ref<SceneGraph::Node>> group;
      convertMultiLevelInstances(group,node);
      auto new_node = new SceneGraph::GroupNode(group);
      object_mapping[node] = new_node;
      return new_node;
    }